

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

void sei_encode_eia608(sei_t *sei,cea708_t *cea708,uint16_t cc_data)

{
  uint16_t uVar1;
  uint16_t in_DX;
  cea708_t *in_RSI;
  cea708_t *in_RDI;
  undefined8 in_stack_ffffffffffffffb8;
  int iVar2;
  eia608_control_t in_stack_ffffffffffffffc0;
  eia608_control_t cmd;
  cea708_t *in_stack_ffffffffffffffc8;
  sei_t *in_stack_ffffffffffffffd0;
  cea708_t *pcVar3;
  undefined8 in_stack_ffffffffffffffe0;
  undefined6 in_stack_ffffffffffffffe8;
  cea708_t *sei_00;
  
  uVar1 = (uint16_t)((ulong)in_stack_ffffffffffffffe0 >> 0x30);
  if ((*(ushort *)&in_RSI->user_data >> 3 & 0x1f) == 0x1f) {
    sei_append_708(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  if ((*(ushort *)&in_RSI->user_data >> 3 & 0x1f) == 0) {
    iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    pcVar3 = in_RSI;
    uVar1 = eia608_control_command(in_stack_ffffffffffffffc0,iVar2);
    cea708_add_cc_data(in_RSI,1,cc_type_ntsc_cc_field_1,uVar1);
    in_RSI = pcVar3;
    uVar1 = eia608_control_command(in_stack_ffffffffffffffc0,iVar2);
    cea708_add_cc_data(pcVar3,1,cc_type_ntsc_cc_field_1,uVar1);
    uVar1 = (uint16_t)((ulong)pcVar3 >> 0x30);
  }
  if (in_DX == 0) {
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    pcVar3 = in_RSI;
    eia608_control_command((eia608_control_t)in_RSI,iVar2);
    cmd = (eia608_control_t)in_RSI;
    sei_encode_eia608((sei_t *)pcVar3,(cea708_t *)CONCAT26(in_DX,in_stack_ffffffffffffffe8),uVar1);
    sei_00 = pcVar3;
    eia608_control_command(cmd,iVar2);
    sei_encode_eia608((sei_t *)sei_00,(cea708_t *)CONCAT26(in_DX,in_stack_ffffffffffffffe8),uVar1);
    sei_append_708((sei_t *)pcVar3,in_RDI);
  }
  else {
    cea708_add_cc_data(in_RSI,1,cc_type_ntsc_cc_field_1,in_DX);
  }
  return;
}

Assistant:

void sei_encode_eia608(sei_t* sei, cea708_t* cea708, uint16_t cc_data)
{
    // This one is full, flush and init a new one
    // shoudl this be 32? I cant remember
    if (31 == cea708->user_data.cc_count) {
        sei_append_708(sei, cea708);
    }

    if (0 == cea708->user_data.cc_count) { // This is a new 708 header, but a continuation of a 608 stream
        cea708_add_cc_data(cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_resume_caption_loading, DEFAULT_CHANNEL));
        cea708_add_cc_data(cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_resume_caption_loading, DEFAULT_CHANNEL));
    }

    if (0 == cc_data) { // Finished
        sei_encode_eia608(sei, cea708, eia608_control_command(eia608_control_end_of_caption, DEFAULT_CHANNEL));
        sei_encode_eia608(sei, cea708, eia608_control_command(eia608_control_end_of_caption, DEFAULT_CHANNEL));
        sei_append_708(sei, cea708);
        return;
    }

    cea708_add_cc_data(cea708, 1, cc_type_ntsc_cc_field_1, cc_data);
}